

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O1

char * SoapySDRDevice_readSensor(SoapySDRDevice *device,char *key)

{
  undefined1 *puVar1;
  char *__dest;
  allocator local_61;
  undefined1 *local_60;
  size_t local_58;
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014ce80);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string((string *)local_40,key,&local_61);
  (**(code **)(*(long *)device + 0x2c8))(&local_60,device,local_40);
  __dest = callocArrayType<char>(local_58 + 1);
  if (local_58 != 0) {
    memmove(__dest,local_60,local_58);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return __dest;
}

Assistant:

char *SoapySDRDevice_readSensor(const SoapySDRDevice *device, const char *key)
{
    __SOAPY_SDR_C_TRY
    return toCString(device->readSensor(key));
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}